

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O3

void __thiscall FLevelLocals::AddScroller(FLevelLocals *this,int secnum)

{
  int iVar1;
  size_t __n;
  
  iVar1 = numsectors;
  if ((-1 < secnum) && ((this->Scrolls).Count == 0)) {
    if (numsectors == 0) {
      __n = 0;
    }
    else {
      TArray<TVector2<double>,_TVector2<double>_>::Grow(&this->Scrolls,numsectors);
      __n = (long)numsectors << 4;
    }
    (this->Scrolls).Count = iVar1;
    memset((this->Scrolls).Array,0,__n);
    return;
  }
  return;
}

Assistant:

void FLevelLocals::AddScroller (int secnum)
{
	if (secnum < 0)
	{
		return;
	}
	if (Scrolls.Size() == 0)
	{
		Scrolls.Resize(numsectors);
		memset (&Scrolls[0], 0, sizeof(Scrolls[0])*numsectors);
	}
}